

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynFunctionArgument * ParseFunctionArgument(ParseContext *ctx,bool lastExplicit,SynBase *lastType)

{
  uint uVar1;
  Lexeme *begin;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  SynBase *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *this_00;
  undefined4 extraout_var_01;
  SynFunctionArgument *this_01;
  Lexeme *pLVar6;
  char *pcVar7;
  SynIdentifier *this;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  uVar2 = ParseContext::Consume(ctx,"explicit");
  pSVar5 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar5 == (SynBase *)0x0) {
    if ((bool)uVar2) {
      pLVar6 = ctx->currentLexeme;
      pcVar7 = "ERROR: type name not found after \'explicit\' specifier";
LAB_0021bdb6:
      anon_unknown.dwarf_169315::Stop(ctx,pLVar6,pcVar7);
    }
    this_01 = (SynFunctionArgument *)0x0;
  }
  else {
    if ((lastType != (SynBase *)0x0) && (pLVar6 = ctx->currentLexeme, pLVar6->type != lex_string)) {
      if ((bool)uVar2) {
        pcVar7 = "ERROR: variable name not found after type in function variable list";
        goto LAB_0021bdb6;
      }
      ctx->currentLexeme = begin;
      pSVar5 = lastType;
      uVar2 = lastExplicit;
    }
    bVar3 = anon_unknown.dwarf_169315::CheckAt
                      (ctx,lex_string,
                       "ERROR: variable name not found after type in function variable list");
    if (bVar3) {
      pLVar6 = ctx->currentLexeme;
      pcVar7 = pLVar6->pos;
      uVar1 = pLVar6->length;
      if (pLVar6->type != lex_none) {
        ctx->currentLexeme = pLVar6 + 1;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021bd80;
      pLVar6 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)this,4,pLVar6,pLVar6);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (this->name).begin = pcVar7;
      (this->name).end = pcVar7 + uVar1;
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar4);
      (this->super_SynBase).typeID = 4;
      (this->super_SynBase).begin = (Lexeme *)0x0;
      (this->super_SynBase).end = (Lexeme *)0x0;
      (this->super_SynBase).pos.begin = (char *)0x0;
      (this->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(this->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(this->super_SynBase).next + 2) = 0;
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (this->name).begin = (char *)0x0;
      (this->name).end = (char *)0x0;
    }
    if (ctx->currentLexeme->type == lex_set) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      this_00 = ParseTernaryExpr(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_169315::Report
                  (ctx,ctx->currentLexeme,"ERROR: default argument value not found after \'=\'");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar4);
        SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
      }
    }
    else {
      this_00 = (SynBase *)0x0;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynFunctionArgument *)CONCAT44(extraout_var_02,iVar4);
    pLVar6 = ctx->currentLexeme;
    if (begin != pLVar6) {
      if (pLVar6 <= ctx->firstLexeme) {
LAB_0021bd80:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      pLVar6 = pLVar6 + -1;
    }
    SynBase::SynBase((SynBase *)this_01,0x36,begin,pLVar6);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6da0;
    (this_01->super_SynBase).field_0x3a = uVar2;
    this_01->type = pSVar5;
    this_01->name = this;
    this_01->initializer = this_00;
  }
  return this_01;
}

Assistant:

SynFunctionArgument* ParseFunctionArgument(ParseContext &ctx, bool lastExplicit, SynBase *lastType)
{
	Lexeme *start = ctx.currentLexeme;

	bool isExplicit = ctx.Consume("explicit");

	if(SynBase *type = ParseType(ctx))
	{
		if(!ctx.At(lex_string) && lastType)
		{
			if(isExplicit)
				Stop(ctx, ctx.Current(), "ERROR: variable name not found after type in function variable list");

			// Backtrack
			ctx.currentLexeme = start;

			isExplicit = lastExplicit;
			type = lastType;
		}

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: variable name not found after type in function variable list"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseTernaryExpr(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: default argument value not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(start, start == ctx.currentLexeme ? ctx.Current() : ctx.Previous(), isExplicit, type, nameIdentifier, initializer);
	}

	if(isExplicit)
		Stop(ctx, ctx.Current(), "ERROR: type name not found after 'explicit' specifier");

	return NULL;
}